

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring64_bitmap_add_bulk(roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  ulong *puVar1;
  ulong uVar2;
  art_val_t *paVar3;
  container_t *pcVar4;
  undefined8 *c;
  container_t *pcVar5;
  leaf_t val_00;
  uint8_t uVar6;
  uint16_t val_01;
  uint8_t typecode2_1;
  uint8_t typecode2;
  uint8_t high48 [6];
  uint8_t typecode;
  uint8_t local_3a;
  uint8_t local_39;
  uint local_38;
  ushort local_34;
  uint8_t local_31;
  
  local_38 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_34 = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  puVar1 = context->leaf;
  val_01 = (uint16_t)val;
  if ((puVar1 == (ulong *)0x0) ||
     (*(ushort *)(context->high_bytes + 4) != local_34 || *(uint *)context->high_bytes != local_38))
  {
    paVar3 = art_find(&r->art,(art_key_chunk_t *)&local_38);
    if (paVar3 == (art_val_t *)0x0) {
      c = (undefined8 *)(*global_memory_hook.malloc)(0x10);
      if (c != (undefined8 *)0x0) {
        *c = 0;
        c[1] = 0;
      }
      pcVar5 = container_add(c,val_01,'\x02',&local_31);
      val_00 = add_container(r,pcVar5,local_31);
      paVar3 = art_insert(&r->art,(art_key_chunk_t *)&local_38,val_00);
    }
    else {
      pcVar5 = r->containers[*paVar3 >> 8];
      uVar6 = (uint8_t)*paVar3;
      pcVar4 = container_add(pcVar5,val_01,uVar6,&local_39);
      if (pcVar4 != pcVar5) {
        container_free(pcVar5,uVar6);
        uVar2 = *paVar3;
        r->containers[uVar2 >> 8] = pcVar4;
        *paVar3 = CONCAT71((int7)(uVar2 >> 8),local_39);
      }
    }
    context->leaf = paVar3;
    *(uint *)context->high_bytes = local_38;
    *(ushort *)(context->high_bytes + 4) = local_34;
  }
  else {
    pcVar5 = r->containers[*puVar1 >> 8];
    uVar6 = (uint8_t)*puVar1;
    pcVar4 = container_add(pcVar5,val_01,uVar6,&local_3a);
    if (pcVar4 != pcVar5) {
      container_free(pcVar5,uVar6);
      uVar2 = *puVar1;
      r->containers[uVar2 >> 8] = pcVar4;
      *puVar1 = CONCAT71((int7)(uVar2 >> 8),local_3a);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_add_bulk(roaring64_bitmap_t *r,
                               roaring64_bulk_context_t *context,
                               uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = context->leaf;
    if (leaf != NULL && compare_high48(context->high_bytes, high48) == 0) {
        // We're at a container with the correct high bits.
        uint8_t typecode1 = get_typecode(*leaf);
        container_t *container1 = get_container(r, *leaf);
        uint8_t typecode2;
        container_t *container2 =
            container_add(container1, low16, typecode1, &typecode2);
        if (container2 != container1) {
            container_free(container1, typecode1);
            replace_container(r, leaf, container2, typecode2);
        }
    } else {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf = (leaf_t *)art_find(&r->art, high48);
        context->leaf =
            containerptr_roaring64_bitmap_add(r, high48, low16, leaf);
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
}